

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

int tinyformat::detail::parseIntAndAdvance(char **c)

{
  long lVar1;
  bool bVar2;
  long *in_RDI;
  long in_FS_OFFSET;
  int i;
  undefined4 local_14;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_14 = 0;
  while( true ) {
    bVar2 = false;
    if ('/' < *(char *)*in_RDI) {
      bVar2 = *(char *)*in_RDI < ':';
    }
    if (!bVar2) break;
    local_14 = local_14 * 10 + *(char *)*in_RDI + -0x30;
    *in_RDI = *in_RDI + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_14;
  }
  __stack_chk_fail();
}

Assistant:

inline int parseIntAndAdvance(const char*& c)
{
    int i = 0;
    for (;*c >= '0' && *c <= '9'; ++c)
        i = 10*i + (*c - '0');
    return i;
}